

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

void __thiscall
glcts::ViewportArray::APIErrors::depthRangeArrayHelper<double>
          (APIErrors *this,DepthFuncWrapper *depthFunc,GLint max_viewports,bool *test_result,
          double *param_4)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  vector<double,_std::allocator<double>_> data;
  
  data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize(&data,(long)(max_viewports * 2));
  lVar1 = 0;
  iVar2 = 0;
  if (0 < max_viewports) {
    iVar2 = max_viewports;
  }
  for (uVar3 = 0; (uint)(iVar2 * 2) != uVar3; uVar3 = uVar3 + 2) {
    *(undefined8 *)
     ((long)data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start + (lVar1 >> 0x1d)) = 0;
    data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[(int)uVar3 + 1] = 1.0;
    lVar1 = lVar1 + 0x200000000;
  }
  (*depthFunc->m_gl->depthRangeArrayv)
            (0,max_viewports + -1,
             data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  checkGLError(this,0,"depthRangeArray, correct parameters",test_result);
  (*depthFunc->m_gl->depthRangeArrayv)
            (max_viewports,1,
             data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  checkGLError(this,0x501,"depthRangeArray, <first> == GL_MAX_VIEWPORTS",test_result);
  (*depthFunc->m_gl->depthRangeArrayv)
            (1,max_viewports + -1,
             data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  checkGLError(this,0,"depthRangeArray, <first> + <count> == GL_MAX_VIEWPORTS",test_result);
  (*depthFunc->m_gl->depthRangeArrayv)
            (1,max_viewports,
             data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  checkGLError(this,0x501,"depthRangeArray, <first> + <count> > GL_MAX_VIEWPORTS",test_result);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&data.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void APIErrors::depthRangeArrayHelper(Utils::DepthFuncWrapper& depthFunc, GLint max_viewports, bool& test_result, T*)
{
	std::vector<T> data;
	data.resize(max_viewports * 2 /* near + far */);

	for (GLint i = 0; i < max_viewports; ++i)
	{
		data[i * 2]		= (T)0.0;
		data[i * 2 + 1] = (T)1.0;
	}

	depthFunc.depthRangeArray(0, max_viewports - 1, &data[0]);
	checkGLError(GL_NO_ERROR, "depthRangeArray, correct parameters", test_result);

	depthFunc.depthRangeArray(max_viewports, 1, &data[0]);
	checkGLError(GL_INVALID_VALUE, "depthRangeArray, <first> == GL_MAX_VIEWPORTS", test_result);

	depthFunc.depthRangeArray(1, max_viewports - 1, &data[0]);
	checkGLError(GL_NO_ERROR, "depthRangeArray, <first> + <count> == GL_MAX_VIEWPORTS", test_result);

	depthFunc.depthRangeArray(1, max_viewports, &data[0]);
	checkGLError(GL_INVALID_VALUE, "depthRangeArray, <first> + <count> > GL_MAX_VIEWPORTS", test_result);
}